

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  uint32 val;
  PatchList PVar1;
  int id;
  bool nongreedy_local;
  Compiler *this_local;
  Frag a_local;
  
  val = AllocInst(this,1);
  if ((int)val < 0) {
    a_local = NoMatch(this);
  }
  else {
    Prog::Inst::InitAlt(this->inst_ + (int)val,0,0);
    this_local._4_4_ = a.end.p;
    PatchList::Patch(this->inst_,this_local._4_4_,val);
    this_local._0_4_ = a.begin;
    if (nongreedy) {
      this->inst_[(int)val].field_1.cap_ = (uint32)this_local;
      PVar1 = PatchList::Mk(val << 1);
      Frag::Frag(&a_local,val,PVar1);
    }
    else {
      Prog::Inst::set_out(this->inst_ + (int)val,(uint32)this_local);
      PVar1 = PatchList::Mk(val << 1 | 1);
      Frag::Frag(&a_local,val,PVar1);
    }
  }
  return a_local;
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitAlt(0, 0);
  PatchList::Patch(inst_, a.end, id);
  if (nongreedy) {
    inst_[id].out1_ = a.begin;
    return Frag(id, PatchList::Mk(id << 1));
  } else {
    inst_[id].set_out(a.begin);
    return Frag(id, PatchList::Mk((id << 1) | 1));
  }
}